

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

VP8Encoder * InitVP8Encoder(WebPConfig *config,WebPPicture *picture)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  VP8MBInfo *pVVar8;
  LFStats *paadVar9;
  uint8_t *puVar10;
  VP8Encoder *enc_00;
  WebPPicture *in_RSI;
  WebPConfig *in_RDI;
  float scale;
  uint64_t size;
  uint8_t *mem;
  size_t top_derr_size;
  size_t lf_stats_size;
  size_t samples_size;
  size_t info_size;
  size_t nz_size;
  int top_stride;
  size_t preds_size;
  int preds_h;
  int preds_w;
  int mb_h;
  int mb_w;
  int use_filter;
  VP8Encoder *enc;
  uint local_a4;
  size_t in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  long local_90;
  VP8Encoder *local_8;
  
  bVar1 = true;
  if (in_RDI->filter_strength < 1) {
    bVar1 = 0 < in_RDI->autofilter;
  }
  iVar2 = in_RSI->width + 0xf >> 4;
  iVar3 = in_RSI->height + 0xf >> 4;
  iVar4 = iVar2 * 4 + 1;
  lVar6 = (long)(iVar4 * (iVar3 * 4 + 1));
  iVar5 = iVar2 * iVar3;
  lVar7 = 0;
  if (in_RDI->autofilter != 0) {
    lVar7 = 0x81f;
  }
  if ((in_RDI->quality <= 98.0) || (1 < in_RDI->pass)) {
    local_90 = (long)iVar2 << 2;
  }
  else {
    local_90 = 0;
  }
  local_8 = (VP8Encoder *)WebPSafeMalloc(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (local_8 == (VP8Encoder *)0x0) {
    WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_OUT_OF_MEMORY);
    local_8 = (VP8Encoder *)0x0;
  }
  else {
    pVVar8 = (VP8MBInfo *)
             ((ulong)((long)&local_8[1].filter_hdr_.i4x4_lf_delta_ + 3) & 0xffffffffffffffe0);
    memset(local_8,0,0x5c98);
    local_8->num_parts_ = 1 << ((byte)in_RDI->partitions & 0x1f);
    local_8->mb_w_ = iVar2;
    local_8->mb_h_ = iVar3;
    local_8->preds_w_ = iVar4;
    local_8->mb_info_ = pVVar8;
    local_8->preds_ = &pVVar8[iVar5].alpha_ + local_8->preds_w_;
    local_8->nz_ = (uint32_t *)
                   (((ulong)(&pVVar8[(long)iVar5 + 7].field_0x3 + lVar6) & 0xffffffffffffffe0) + 4);
    if (lVar7 == 0) {
      paadVar9 = (LFStats *)0x0;
    }
    else {
      paadVar9 = (LFStats *)
                 ((ulong)(&pVVar8[(long)iVar5 + (long)(iVar2 + 1) + 0xf].field_0x2 + lVar6) &
                 0xffffffffffffffe0);
    }
    local_8->lf_stats_ = paadVar9;
    puVar10 = (uint8_t *)
              ((ulong)(&pVVar8[(long)iVar5 + (long)(iVar2 + 1) + 0xf].field_0x2 + lVar7 + lVar6) &
              0xffffffffffffffe0);
    local_8->y_top_ = puVar10;
    local_8->uv_top_ = local_8->y_top_ + (iVar2 << 4);
    enc_00 = (VP8Encoder *)(puVar10 + (iVar2 << 5));
    if (local_90 == 0) {
      enc_00 = (VP8Encoder *)0x0;
    }
    local_8->top_derr_ = (DError *)enc_00;
    local_8->config_ = in_RDI;
    if (bVar1) {
      local_a4 = (uint)(in_RDI->filter_type != 1);
    }
    else {
      local_a4 = 2;
    }
    local_8->profile_ = local_a4;
    local_8->pic_ = in_RSI;
    local_8->percent_ = 0;
    MapConfigToTools(local_8);
    VP8EncDspInit();
    VP8DefaultProbas(enc_00);
    ResetSegmentHeader(local_8);
    ResetFilterHeader(local_8);
    ResetBoundaryPredictions(local_8);
    VP8EncDspCostInit();
    VP8EncInitAlpha(enc_00);
    VP8TBufferInit(&local_8->tokens_,
                   (int)((float)(iVar2 * iVar3 * 4) * ((in_RDI->quality * 5.0) / 100.0 + 1.0)));
  }
  return local_8;
}

Assistant:

static VP8Encoder* InitVP8Encoder(const WebPConfig* const config,
                                  WebPPicture* const picture) {
  VP8Encoder* enc;
  const int use_filter =
      (config->filter_strength > 0) || (config->autofilter > 0);
  const int mb_w = (picture->width + 15) >> 4;
  const int mb_h = (picture->height + 15) >> 4;
  const int preds_w = 4 * mb_w + 1;
  const int preds_h = 4 * mb_h + 1;
  const size_t preds_size = preds_w * preds_h * sizeof(*enc->preds_);
  const int top_stride = mb_w * 16;
  const size_t nz_size = (mb_w + 1) * sizeof(*enc->nz_) + WEBP_ALIGN_CST;
  const size_t info_size = mb_w * mb_h * sizeof(*enc->mb_info_);
  const size_t samples_size =
      2 * top_stride * sizeof(*enc->y_top_)  // top-luma/u/v
      + WEBP_ALIGN_CST;                      // align all
  const size_t lf_stats_size =
      config->autofilter ? sizeof(*enc->lf_stats_) + WEBP_ALIGN_CST : 0;
  const size_t top_derr_size =
      (config->quality <= ERROR_DIFFUSION_QUALITY || config->pass > 1) ?
          mb_w * sizeof(*enc->top_derr_) : 0;
  uint8_t* mem;
  const uint64_t size = (uint64_t)sizeof(*enc)   // main struct
                      + WEBP_ALIGN_CST           // cache alignment
                      + info_size                // modes info
                      + preds_size               // prediction modes
                      + samples_size             // top/left samples
                      + top_derr_size            // top diffusion error
                      + nz_size                  // coeff context bits
                      + lf_stats_size;           // autofilter stats

#ifdef PRINT_MEMORY_INFO
  printf("===================================\n");
  printf("Memory used:\n"
         "             encoder: %ld\n"
         "                info: %ld\n"
         "               preds: %ld\n"
         "         top samples: %ld\n"
         "       top diffusion: %ld\n"
         "            non-zero: %ld\n"
         "            lf-stats: %ld\n"
         "               total: %ld\n",
         sizeof(*enc) + WEBP_ALIGN_CST, info_size,
         preds_size, samples_size, top_derr_size, nz_size, lf_stats_size, size);
  printf("Transient object sizes:\n"
         "      VP8EncIterator: %ld\n"
         "        VP8ModeScore: %ld\n"
         "      VP8SegmentInfo: %ld\n"
         "         VP8EncProba: %ld\n"
         "             LFStats: %ld\n",
         sizeof(VP8EncIterator), sizeof(VP8ModeScore),
         sizeof(VP8SegmentInfo), sizeof(VP8EncProba),
         sizeof(LFStats));
  printf("Picture size (yuv): %ld\n",
         mb_w * mb_h * 384 * sizeof(uint8_t));
  printf("===================================\n");
#endif
  mem = (uint8_t*)WebPSafeMalloc(size, sizeof(*mem));
  if (mem == NULL) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    return NULL;
  }
  enc = (VP8Encoder*)mem;
  mem = (uint8_t*)WEBP_ALIGN(mem + sizeof(*enc));
  memset(enc, 0, sizeof(*enc));
  enc->num_parts_ = 1 << config->partitions;
  enc->mb_w_ = mb_w;
  enc->mb_h_ = mb_h;
  enc->preds_w_ = preds_w;
  enc->mb_info_ = (VP8MBInfo*)mem;
  mem += info_size;
  enc->preds_ = mem + 1 + enc->preds_w_;
  mem += preds_size;
  enc->nz_ = 1 + (uint32_t*)WEBP_ALIGN(mem);
  mem += nz_size;
  enc->lf_stats_ = lf_stats_size ? (LFStats*)WEBP_ALIGN(mem) : NULL;
  mem += lf_stats_size;

  // top samples (all 16-aligned)
  mem = (uint8_t*)WEBP_ALIGN(mem);
  enc->y_top_ = mem;
  enc->uv_top_ = enc->y_top_ + top_stride;
  mem += 2 * top_stride;
  enc->top_derr_ = top_derr_size ? (DError*)mem : NULL;
  mem += top_derr_size;
  assert(mem <= (uint8_t*)enc + size);

  enc->config_ = config;
  enc->profile_ = use_filter ? ((config->filter_type == 1) ? 0 : 1) : 2;
  enc->pic_ = picture;
  enc->percent_ = 0;

  MapConfigToTools(enc);
  VP8EncDspInit();
  VP8DefaultProbas(enc);
  ResetSegmentHeader(enc);
  ResetFilterHeader(enc);
  ResetBoundaryPredictions(enc);
  VP8EncDspCostInit();
  VP8EncInitAlpha(enc);

  // lower quality means smaller output -> we modulate a little the page
  // size based on quality. This is just a crude 1rst-order prediction.
  {
    const float scale = 1.f + config->quality * 5.f / 100.f;  // in [1,6]
    VP8TBufferInit(&enc->tokens_, (int)(mb_w * mb_h * 4 * scale));
  }
  return enc;
}